

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O1

bool_t prf_color_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint8_t *buffer;
  uint uVar2;
  bool_t bVar3;
  int iVar4;
  ulong uVar5;
  ushort *puVar6;
  uint uVar7;
  
  if (node->opcode == prf_color_palette_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar2 = 4;
    if (0x83 < node->length) {
      buffer = node->data;
      bf_write(bfile,buffer,0x80);
      uVar1 = node->length;
      uVar2 = 0x400;
      if (uVar1 < 0x1088) {
        iVar4 = uVar1 - 0x81;
        if (-1 < (int)(uVar1 - 0x84)) {
          iVar4 = uVar1 - 0x84;
        }
        uVar2 = iVar4 >> 2;
      }
      if (uVar2 == 0) {
        uVar2 = 0x84;
      }
      else {
        uVar5 = 0;
        do {
          bf_put_uint32_be(bfile,*(uint32_t *)(buffer + uVar5 * 4 + 0x80));
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
        uVar2 = uVar2 * 4 + 0x84;
      }
      uVar7 = uVar2 + 4;
      if ((uVar7 <= node->length) &&
         (bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x1080)), uVar2 = uVar7,
         *(int *)(buffer + 0x1080) != 0)) {
        puVar6 = (ushort *)(node->data + ((ulong)uVar7 - 4));
        uVar7 = 0;
        do {
          uVar1 = node->length;
          iVar4 = uVar2 + *puVar6;
          if (iVar4 <= (int)(uint)uVar1) {
            bf_put_uint16_be(bfile,*puVar6);
            bf_put_uint16_be(bfile,puVar6[1]);
            bf_put_uint16_be(bfile,puVar6[2]);
            bf_put_uint16_be(bfile,puVar6[3]);
            bf_write(bfile,(uint8_t *)(puVar6 + 4),*puVar6 - 8);
            uVar2 = uVar2 + *puVar6;
            puVar6 = (ushort *)((long)puVar6 + (ulong)*puVar6);
          }
        } while ((iVar4 <= (int)(uint)uVar1) &&
                (uVar7 = uVar7 + 1, uVar7 < *(uint *)(buffer + 0x1080)));
      }
    }
    bVar3 = 1;
    uVar7 = node->length - uVar2;
    if (uVar7 != 0 && (int)uVar2 <= (int)(uint)node->length) {
      bf_write(bfile,node->data + (long)(int)uVar2 + -4,uVar7);
    }
  }
  else {
    bVar3 = 0;
    prf_error(3,"tried color palette save method on other node");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_color_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 3, "tried color palette save method on other node" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        unsigned int num, i;
        uint8_t * ptr;
        if ( node->length < (pos + 128) ) break;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        num = PRF_MIN( 1024, ((node->length - 132) / 4) );
        for ( i = 0; i < num; i++ ) {
            bf_put_uint32_be( bfile, data->brightest_rgb[i] ); pos += 4;
        }
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->num_color_names ); pos += 4;
        ptr = node->data + pos - 4;

        for ( i = 0; i < data->num_color_names; i++ ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            if ( node->length < (pos + cdata->length) ) break;
            bf_put_uint16_be( bfile, cdata->length );
            bf_put_uint16_be( bfile, cdata->reserved1 );
            bf_put_uint16_be( bfile, cdata->index );
            bf_put_uint16_be( bfile, cdata->reserved2 );
            bf_write( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
        }

    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}